

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cpp
# Opt level: O2

void __thiscall cppcms::crypto::hmac::readout(hmac *this,void *ptr)

{
  message_digest *pmVar1;
  uint uVar2;
  EVP_PKEY_CTX *ctx;
  vector<unsigned_char,_std::allocator<unsigned_char>_> digest;
  value_type_conflict3 local_3a;
  allocator_type local_39;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  
  uVar2 = (*((this->md_)._M_t.
             super___uniq_ptr_impl<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
             ._M_t.
             super__Tuple_impl<0UL,_cppcms::crypto::message_digest_*,_std::default_delete<cppcms::crypto::message_digest>_>
             .super__Head_base<0UL,_cppcms::crypto::message_digest_*,_false>._M_head_impl)->
            _vptr_message_digest[2])();
  local_3a = '\0';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_38,(ulong)uVar2,
             &local_3a,&local_39);
  pmVar1 = (this->md_)._M_t.
           super___uniq_ptr_impl<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
           ._M_t.
           super__Tuple_impl<0UL,_cppcms::crypto::message_digest_*,_std::default_delete<cppcms::crypto::message_digest>_>
           .super__Head_base<0UL,_cppcms::crypto::message_digest_*,_false>._M_head_impl;
  (*pmVar1->_vptr_message_digest[5])(pmVar1,local_38._M_impl.super__Vector_impl_data._M_start);
  pmVar1 = (this->md_opad_)._M_t.
           super___uniq_ptr_impl<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
           ._M_t.
           super__Tuple_impl<0UL,_cppcms::crypto::message_digest_*,_std::default_delete<cppcms::crypto::message_digest>_>
           .super__Head_base<0UL,_cppcms::crypto::message_digest_*,_false>._M_head_impl;
  uVar2 = (*((this->md_)._M_t.
             super___uniq_ptr_impl<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
             ._M_t.
             super__Tuple_impl<0UL,_cppcms::crypto::message_digest_*,_std::default_delete<cppcms::crypto::message_digest>_>
             .super__Head_base<0UL,_cppcms::crypto::message_digest_*,_false>._M_head_impl)->
            _vptr_message_digest[2])();
  (*pmVar1->_vptr_message_digest[4])
            (pmVar1,local_38._M_impl.super__Vector_impl_data._M_start,(ulong)uVar2);
  pmVar1 = (this->md_opad_)._M_t.
           super___uniq_ptr_impl<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
           ._M_t.
           super__Tuple_impl<0UL,_cppcms::crypto::message_digest_*,_std::default_delete<cppcms::crypto::message_digest>_>
           .super__Head_base<0UL,_cppcms::crypto::message_digest_*,_false>._M_head_impl;
  (*pmVar1->_vptr_message_digest[5])(pmVar1,ptr);
  uVar2 = (*((this->md_)._M_t.
             super___uniq_ptr_impl<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
             ._M_t.
             super__Tuple_impl<0UL,_cppcms::crypto::message_digest_*,_std::default_delete<cppcms::crypto::message_digest>_>
             .super__Head_base<0UL,_cppcms::crypto::message_digest_*,_false>._M_head_impl)->
            _vptr_message_digest[2])();
  ctx = (EVP_PKEY_CTX *)(ulong)uVar2;
  local_3a = '\0';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_fill_assign
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_38,(size_type)ctx,
             &local_3a);
  init(this,ctx);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_38);
  return;
}

Assistant:

void hmac::readout(void *ptr)
	{
		std::vector<unsigned char> digest(md_->digest_size(),0);
		md_->readout(&digest.front()); // md_ is reset
		md_opad_->append(&digest.front(),md_->digest_size());
		md_opad_->readout(ptr); // md_opad_ is reset now
		digest.assign(md_->digest_size(),0);
		init();
	}